

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

ClauseHead * Clasp::ClauseCreator::newProblemClause(Solver *s,ClauseRep *clause,uint32 flags)

{
  Literal *pLVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  ClauseHead *c;
  SharedLiterals *shared_lits;
  uint uVar7;
  uint32 uVar8;
  uint32 i;
  uint uVar9;
  ulong uVar10;
  
  if ((flags >> 10 & 1) == 0) {
    uVar4 = 0;
    if ((flags >> 0xb & 1) == 0) {
      uVar4 = 2;
      if ((flags >> 0xc & 1) == 0) {
        uVar4 = SUB84(s->strategy_,4) >> 0xf & 3;
      }
    }
  }
  else {
    uVar4 = 1;
  }
  uVar3 = *(uint *)&clause->field_0x4;
  if (uVar4 != 1 && 2 < (uVar3 & 0x7fffffff)) {
    if (uVar4 == 2) {
      uVar5 = Solver::numWatches(s,(Literal)(clause->lits->rep_ & 0xfffffffe ^ 2));
      uVar6 = Solver::numWatches(s,(Literal)(clause->lits[1].rep_ & 0xfffffffe ^ 2));
      bVar2 = uVar5 <= uVar6;
      uVar8 = uVar6;
      if (!bVar2) {
        uVar8 = uVar5;
        uVar5 = uVar6;
      }
      uVar3 = (uint)!bVar2;
      uVar10 = (ulong)bVar2;
      uVar4 = 2;
      while ((uVar4 != (*(uint *)&clause->field_0x4 & 0x7fffffff) && (uVar8 != 0))) {
        uVar6 = Solver::numWatches(s,(Literal)(clause->lits[uVar4].rep_ & 0xfffffffe ^ 2));
        uVar9 = uVar6;
        uVar7 = uVar4;
        if (uVar6 < uVar5) {
          uVar9 = uVar5;
          uVar5 = uVar6;
          uVar7 = uVar3;
          uVar3 = uVar4;
        }
        if (uVar9 < uVar8) {
          uVar10 = (ulong)uVar7;
          uVar8 = uVar9;
        }
        uVar4 = uVar4 + 1;
      }
    }
    else if (uVar4 == 0) {
      uVar3 = RNG::irand(&s->rng,uVar3 & 0x7fffffff);
      do {
        uVar4 = RNG::irand(&s->rng,*(uint *)&clause->field_0x4 & 0x7fffffff);
      } while (uVar4 == uVar3);
      uVar10 = (ulong)uVar4;
    }
    else {
      uVar10 = 1;
      uVar3 = 0;
    }
    pLVar1 = clause->lits;
    uVar8 = pLVar1->rep_;
    pLVar1->rep_ = pLVar1[uVar3].rep_;
    pLVar1[uVar3].rep_ = uVar8;
    uVar8 = pLVar1[1].rep_;
    pLVar1[1].rep_ = pLVar1[uVar10].rep_;
    pLVar1[uVar10].rep_ = uVar8;
    uVar3 = *(uint *)&clause->field_0x4;
  }
  if (((uVar3 & 0x7ffffffe) < 6) || (((s->shared_->share_).field_0x2 & 0x10) == 0)) {
    c = Clause::newClause(s,clause);
  }
  else {
    shared_lits = SharedLiterals::newShareable
                            (clause->lits,uVar3 & 0x7fffffff,
                             (clause->info).super_ConstraintScore.rep >> 0x1c & Other,1);
    c = mt::SharedLitsClause::newClause(s,shared_lits,&clause->info,clause->lits,false);
  }
  if ((flags & 1) == 0) {
    Solver::add(s,&c->super_Constraint);
  }
  return c;
}

Assistant:

ClauseHead* ClauseCreator::newProblemClause(Solver& s, const ClauseRep& clause, uint32 flags) {
	ClauseHead* ret;
	Solver::WatchInitMode wMode = s.watchInitMode();
	if      (flags&clause_watch_first){ wMode = SolverStrategies::watch_first;}
	else if (flags&clause_watch_rand) { wMode = SolverStrategies::watch_rand; }
	else if (flags&clause_watch_least){ wMode = SolverStrategies::watch_least;}
	if (clause.size > 2 && wMode != SolverStrategies::watch_first) {
		uint32 fw = 0, sw = 1;
		if (wMode == SolverStrategies::watch_rand) {
			fw = s.rng.irand(clause.size);
			do { sw = s.rng.irand(clause.size); } while (sw == fw);
		}
		else if (wMode == SolverStrategies::watch_least) {
			uint32 cw1 = s.numWatches(~clause.lits[0]);
			uint32 cw2 = s.numWatches(~clause.lits[1]);
			if (cw1 > cw2) { std::swap(fw, sw); std::swap(cw1, cw2); }
			for (uint32 i = 2; i != clause.size && cw2; ++i) {
				uint32 p   = i;
				uint32 cwp = s.numWatches(~clause.lits[i]);
				if (cwp < cw1) { std::swap(cwp, cw1); std::swap(fw, p); }
				if (cwp < cw2) { std::swap(cwp, cw2); std::swap(sw, p); }
			}
		}
		std::swap(clause.lits[0], clause.lits[fw]);
		std::swap(clause.lits[1], clause.lits[sw]);
	}
	if (clause.size <= Clause::MAX_SHORT_LEN || !s.sharedContext()->physicalShareProblem()) {
		ret = Clause::newClause(s, clause);
	}
	else {
		ret = Clause::newShared(s, SharedLiterals::newShareable(clause.lits, clause.size, clause.info.type(), 1), clause.info, clause.lits, false);
	}
	if ( (flags & clause_no_add) == 0 ) {
		assert(!clause.info.aux());
		s.add(ret);
	}
	return ret;
}